

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O2

bool __thiscall
spvtools::val::ValidationState_t::EvalConstantValUint64
          (ValidationState_t *this,uint32_t id,uint64_t *val)

{
  uint16_t uVar1;
  pointer puVar2;
  bool bVar3;
  Instruction *pIVar4;
  ulong uVar5;
  long lVar6;
  
  pIVar4 = FindDef(this,id);
  if (pIVar4 == (Instruction *)0x0) {
    __assert_fail("0 && \"Instruction not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                  ,0x5ad,
                  "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                 );
  }
  bVar3 = IsIntScalarType(this,(pIVar4->inst_).type_id);
  if (bVar3) {
    uVar1 = (pIVar4->inst_).opcode;
    uVar5 = 0;
    if (uVar1 != 0x2e) {
      if (uVar1 != 0x2b) goto LAB_005a6e78;
      puVar2 = (pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar6 = (long)(pIVar4->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
      if (lVar6 == 5) {
        uVar5 = *(ulong *)(puVar2 + 3);
      }
      else {
        if (lVar6 != 4) {
          __assert_fail("inst->words().size() == 5",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validation_state.cpp"
                        ,0x5bc,
                        "bool spvtools::val::ValidationState_t::EvalConstantValUint64(uint32_t, uint64_t *) const"
                       );
        }
        uVar5 = (ulong)puVar2[3];
      }
    }
    *val = uVar5;
    uVar5 = 1;
  }
  else {
    uVar5 = 0;
  }
LAB_005a6e78:
  return SUB81(uVar5,0);
}

Assistant:

bool ValidationState_t::EvalConstantValUint64(uint32_t id,
                                              uint64_t* val) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    assert(0 && "Instruction not found");
    return false;
  }

  if (!IsIntScalarType(inst->type_id())) return false;

  if (inst->opcode() == spv::Op::OpConstantNull) {
    *val = 0;
  } else if (inst->opcode() != spv::Op::OpConstant) {
    // Spec constant values cannot be evaluated so don't consider constant for
    // static validation
    return false;
  } else if (inst->words().size() == 4) {
    *val = inst->word(3);
  } else {
    assert(inst->words().size() == 5);
    *val = inst->word(3);
    *val |= uint64_t(inst->word(4)) << 32;
  }
  return true;
}